

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

bool __thiscall
MemoryManager::setLong(MemoryManager *this,uint32_t addr,uint64_t val,uint32_t *cycles)

{
  bool bVar1;
  
  if (this->memory[addr >> 0x16] != (uint8_t **)0x0) {
    bVar1 = true;
    if (*(long *)((long)this->memory[addr >> 0x16] + (ulong)(addr >> 9 & 0x1ff8)) != 0)
    goto LAB_001042e7;
  }
  bVar1 = false;
LAB_001042e7:
  if (bVar1 == false) {
    dbgprintf("Long write to invalid addr 0x%x!\n",addr);
  }
  else {
    setByte(this,addr,(uint8_t)val,cycles);
    setByte(this,addr + 1,(uint8_t)(val >> 8),(uint32_t *)0x0);
    setByte(this,addr + 2,(uint8_t)(val >> 0x10),(uint32_t *)0x0);
    setByte(this,addr + 3,(uint8_t)(val >> 0x18),(uint32_t *)0x0);
    setByte(this,addr + 4,(uint8_t)(val >> 0x20),(uint32_t *)0x0);
    setByte(this,addr + 5,(uint8_t)(val >> 0x28),(uint32_t *)0x0);
    setByte(this,addr + 6,(uint8_t)(val >> 0x30),(uint32_t *)0x0);
    setByte(this,addr + 7,(uint8_t)(val >> 0x38),(uint32_t *)0x0);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setLong(uint32_t addr, uint64_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Long write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  this->setByte(addr + 2, (val >> 16) & 0xFF);
  this->setByte(addr + 3, (val >> 24) & 0xFF);
  this->setByte(addr + 4, (val >> 32) & 0xFF);
  this->setByte(addr + 5, (val >> 40) & 0xFF);
  this->setByte(addr + 6, (val >> 48) & 0xFF);
  this->setByte(addr + 7, (val >> 56) & 0xFF);
  return true;
}